

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_collection_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Collection *coll,uint32_t indent)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  long lVar4;
  uint32_t in_R9D;
  size_t i;
  ulong idx;
  string name;
  string prefix;
  stringstream ss;
  CollectionInstance instance;
  ListEditQual local_d74;
  string *local_d70;
  long local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  ordered_dict<tinyusdz::CollectionInstance> local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  stringstream local_c98 [16];
  ostream local_c88 [376];
  CollectionInstance local_b10;
  
  ::std::__cxx11::stringstream::stringstream(local_c98);
  if (this == (tinyusdz *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_d70 = __return_storage_ptr__;
    ordered_dict<tinyusdz::CollectionInstance>::ordered_dict
              (&local_d00,(ordered_dict<tinyusdz::CollectionInstance> *)this);
    lVar4 = 0;
    idx = 0;
    while( true ) {
      __return_storage_ptr__ = local_d70;
      if (local_d00._m._M_t._M_impl.super__Rb_tree_header._M_node_count <= idx) break;
      local_d68 = lVar4;
      ::std::__cxx11::string::string
                ((string *)&local_d20,
                 (string *)
                 ((long)&((local_d00._keys.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
      CollectionInstance::CollectionInstance(&local_b10);
      bVar1 = ordered_dict<tinyusdz::CollectionInstance>::at(&local_d00,idx,&local_b10);
      if (bVar1) {
        ::std::__cxx11::string::string((string *)&local_cb8,"collection",(allocator *)&local_d60);
        if (local_d20._M_string_length != 0) {
          ::std::operator+(&local_d60,":",&local_d20);
          ::std::__cxx11::string::append((string *)&local_cb8);
          ::std::__cxx11::string::_M_dispose();
        }
        if ((((local_b10.expansionRule._empty != false) ||
             (local_b10.expansionRule._attrib.has_value_ != false)) ||
            (local_b10.expansionRule._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_b10.expansionRule._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start)) || (local_b10.expansionRule._blocked == true)) {
          ::std::operator+(&local_d40,&local_cb8,":expansionRule");
          print_typed_token_attr<tinyusdz::CollectionInstance::ExpansionRule>
                    (&local_d60,&local_b10.expansionRule,(string *)&local_d40,(uint32_t)coll);
          ::std::operator<<(local_c88,(string *)&local_d60);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (((local_b10.includeRoot._empty != false) ||
            (local_b10.includeRoot._attrib.has_value_ != false)) ||
           ((local_b10.includeRoot._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_b10.includeRoot._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start || (local_b10.includeRoot._blocked == true)))) {
          ::std::operator+(&local_d40,&local_cb8,":includeRoot");
          print_typed_attr<bool>
                    (&local_d60,&local_b10.includeRoot,(string *)&local_d40,(uint32_t)coll);
          ::std::operator<<(local_c88,(string *)&local_d60);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (local_b10.includes.has_value_ == true) {
          pvVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&local_b10.includes);
          pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&local_b10.includes);
          local_d74 = pvVar3->listOpQual;
          ::std::operator+(&local_d40,&local_cb8,":includes");
          anon_unknown_173::print_relationship
                    (&local_d60,pvVar2,&local_d74,SUB81(&local_d40,0),
                     (string *)((ulong)coll & 0xffffffff),in_R9D);
          ::std::operator<<(local_c88,(string *)&local_d60);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        if (local_b10.excludes.has_value_ == true) {
          pvVar2 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&local_b10.excludes);
          pvVar3 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             (&local_b10.excludes);
          local_d74 = pvVar3->listOpQual;
          ::std::operator+(&local_d40,&local_cb8,":excludes");
          anon_unknown_173::print_relationship
                    (&local_d60,pvVar2,&local_d74,SUB81(&local_d40,0),
                     (string *)((ulong)coll & 0xffffffff),in_R9D);
          ::std::operator<<(local_c88,(string *)&local_d60);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
      }
      CollectionInstance::~CollectionInstance(&local_b10);
      ::std::__cxx11::string::_M_dispose();
      idx = idx + 1;
      lVar4 = local_d68 + 0x20;
    }
    ::std::__cxx11::stringbuf::str();
    ordered_dict<tinyusdz::CollectionInstance>::~ordered_dict(&local_d00);
  }
  ::std::__cxx11::stringstream::~stringstream(local_c98);
  return __return_storage_ptr__;
}

Assistant:

std::string print_collection(const Collection *coll, const uint32_t indent) {
  std::stringstream ss;

  if (!coll) {
    return std::string();
  }

  const auto &instances = coll->instances();

  for (size_t i = 0; i < instances.size(); i++) {
    std::string name = instances.keys()[i];

    CollectionInstance instance;
    if (!instances.at(i, &instance)) {
      continue;
    }

    std::string prefix = "collection";
    if (name.size()) {
      prefix += ":" + name;
    }

    if (instance.expansionRule.authored()) {
      ss << print_typed_token_attr(instance.expansionRule, prefix + ":expansionRule", indent);

    }


    if (instance.includeRoot.authored()) {
      ss << print_typed_attr(instance.includeRoot, prefix + ":includeRoot", indent);
    }

    if (instance.includes) {
      ss << print_relationship(
          instance.includes.value(),
          instance.includes.value().get_listedit_qual(),
          /* custom */ false, prefix + ":includes", indent);
        
    }

    if (instance.excludes) {
      ss << print_relationship(
          instance.excludes.value(),
          instance.excludes.value().get_listedit_qual(),
          /* custom */ false, prefix + ":excludes", indent);
        
    }
  }

  return ss.str();
}